

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_setup_connection(connectdata *conn)

{
  Curl_easy *pCVar1;
  char *string;
  char cVar2;
  _Bool _Var3;
  long *plVar4;
  CURLcode CVar5;
  char *pcVar6;
  
  pCVar1 = conn->data;
  plVar4 = (long *)(*Curl_cmalloc)(0x28);
  (conn->data->req).protop = plVar4;
  if (plVar4 != (long *)0x0) {
    pcVar6 = (pCVar1->state).path + 1;
    (pCVar1->state).path = pcVar6;
    (pCVar1->state).slash_removed = true;
    pcVar6 = strstr(pcVar6,";type=");
    if ((pcVar6 != (char *)0x0) ||
       (pcVar6 = strstr((conn->host).rawalloc,";type="), pcVar6 != (char *)0x0)) {
      *pcVar6 = '\0';
      cVar2 = Curl_raw_toupper(pcVar6[6]);
      (conn->bits).type_set = true;
      if (cVar2 == 'D') {
        (pCVar1->set).ftp_list_only = true;
      }
      else if (cVar2 == 'A') {
        (pCVar1->set).prefer_ascii = true;
      }
      else {
        (pCVar1->set).prefer_ascii = false;
      }
    }
    *plVar4 = (long)&(conn->data->req).bytecount;
    *(undefined4 *)(plVar4 + 3) = 0;
    plVar4[4] = 0;
    pcVar6 = conn->user;
    plVar4[1] = (long)pcVar6;
    string = conn->passwd;
    plVar4[2] = (long)string;
    _Var3 = isBadFtpString(pcVar6);
    CVar5 = CURLE_URL_MALFORMAT;
    if ((!_Var3) && (_Var3 = isBadFtpString(string), !_Var3)) {
      (conn->proto).ftpc.known_filesize = -1;
      CVar5 = CURLE_OK;
    }
    return CVar5;
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

static CURLcode ftp_setup_connection(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  char *type;
  char command;
  struct FTP *ftp;

  conn->data->req.protop = ftp = malloc(sizeof(struct FTP));
  if(NULL == ftp)
    return CURLE_OUT_OF_MEMORY;

  data->state.path++;   /* don't include the initial slash */
  data->state.slash_removed = TRUE; /* we've skipped the slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we'll try to get now! */
  type = strstr(data->state.path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);
    conn->bits.type_set = TRUE;

    switch(command) {
    case 'A': /* ASCII mode */
      data->set.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->set.ftp_list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->set.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->bytecountp = &conn->data->req.bytecount;
  ftp->transfer = FTPTRANSFER_BODY;
  ftp->downloadsize = 0;

  /* No need to duplicate user+password, the connectdata struct won't change
     during a session, but we re-init them here since on subsequent inits
     since the conn struct may have changed or been replaced.
  */
  ftp->user = conn->user;
  ftp->passwd = conn->passwd;
  if(isBadFtpString(ftp->user))
    return CURLE_URL_MALFORMAT;
  if(isBadFtpString(ftp->passwd))
    return CURLE_URL_MALFORMAT;

  conn->proto.ftpc.known_filesize = -1; /* unknown size for now */

  return CURLE_OK;
}